

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O2

void __thiscall
LINAnalyzerResults::GenerateExportFile
          (LINAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  undefined2 uVar1;
  ulonglong uVar2;
  char cVar3;
  uint uVar4;
  ulonglong uVar5;
  ostream *poVar6;
  ulong uVar7;
  ulonglong *puVar8;
  U64 UVar9;
  ulong uVar10;
  U64 last_frame;
  Frame frame;
  undefined2 local_378;
  U64 first_frame;
  ulonglong local_360 [2];
  ulonglong local_350;
  undefined2 local_340;
  ofstream file_stream;
  char time_str [128];
  char number_str [128];
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar5 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  poVar6 = std::operator<<((ostream *)&file_stream,"T.BREAK,BREAK,T.SYNC,SYNC,T.PID,PID,T.D,Dn...");
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar7 = AnalyzerResults::GetNumFrames();
  uVar10 = 0;
  do {
    if (uVar7 <= uVar10) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
      std::ofstream::close();
LAB_00109a64:
      std::ofstream::~ofstream(&file_stream);
      return;
    }
    AnalyzerResults::GetFrame((ulonglong)&frame);
    if ((char)local_378 == '\x01') {
      puVar8 = (ulonglong *)AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
      if (puVar8 != (ulonglong *)0xffffffffffffffff) {
        AnalyzerResults::GetFramesContainedInPacket((ulonglong)this,puVar8,&first_frame);
        for (UVar9 = first_frame; UVar9 <= last_frame; UVar9 = UVar9 + 1) {
          AnalyzerResults::GetFrame((ulonglong)local_360);
          uVar1 = local_340;
          uVar2 = local_350;
          local_378 = local_340;
          _frame = local_360[0];
          Frame::~Frame((Frame *)local_360);
          local_378._0_1_ = (char)uVar1;
          if ((char)local_378 != '\0') {
            AnalyzerHelpers::GetTimeString(_frame,uVar5,uVar4,time_str,0x80);
            uVar10 = (ulong)((uint)uVar2 & 0x3f);
            if ((char)local_378 != '\x03') {
              uVar10 = uVar2;
            }
            AnalyzerHelpers::GetNumberString(uVar10,display_base,8,number_str,0x80);
            poVar6 = std::operator<<((ostream *)&file_stream,time_str);
            poVar6 = std::operator<<(poVar6,",");
            std::operator<<(poVar6,number_str);
            if (UVar9 < last_frame) {
              std::operator<<((ostream *)&file_stream,",");
            }
          }
          local_378 = uVar1;
        }
        std::endl<char,std::char_traits<char>>((ostream *)&file_stream);
        uVar10 = last_frame;
      }
    }
    cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar10);
    if (cVar3 != '\0') {
      std::ofstream::close();
      Frame::~Frame(&frame);
      goto LAB_00109a64;
    }
    Frame::~Frame(&frame);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void LINAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    char time_str[ 128 ];
    char number_str[ 128 ];
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "T.BREAK,BREAK,T.SYNC,SYNC,T.PID,PID,T.D,Dn..." << std::endl;

    U64 num_frames = GetNumFrames();
    for( U64 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        if( frame.mType == headerBreak )
        {
            U64 packet_id = GetPacketContainingFrameSequential( i );

            if( packet_id != INVALID_RESULT_INDEX )
            {
                U64 first_frame;
                U64 last_frame;

                GetFramesContainedInPacket( packet_id, &first_frame, &last_frame );
                // export header time
                for( U64 j = first_frame; j <= last_frame; ++j )
                {
                    frame = GetFrame( j );
                    if( frame.mType == 0 )
                        continue; // skip IBS frames.

                    U64 data = frame.mData1;
                    if( ( LINAnalyzerResults::tLINFrameState )frame.mType == LINAnalyzerResults::headerPID )
                        data = data & 0x3F; // trim the upper 2 bits from the PID frame during eport.

                    AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );
                    AnalyzerHelpers::GetNumberString( data, display_base, 8, number_str, 128 );
                    file_stream << time_str << "," << number_str;
                    if( j < last_frame )
                        file_stream << ",";
                }

                file_stream << std::endl;

                i = last_frame;
            }
        }

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            file_stream.close();
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( 0, 0 );

    file_stream.close();
}